

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

UdpOutputPortDeclSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UdpOutputPortDeclSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::EqualsValueClauseSyntax*&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,EqualsValueClauseSyntax **args_4)

{
  Token keyword;
  Token reg;
  Token name;
  UdpOutputPortDeclSyntax *this_00;
  
  this_00 = (UdpOutputPortDeclSyntax *)allocate(this,0x78,8);
  keyword.kind = args_1->kind;
  keyword._2_1_ = args_1->field_0x2;
  keyword.numFlags.raw = (args_1->numFlags).raw;
  keyword.rawLen = args_1->rawLen;
  keyword.info = args_1->info;
  reg.kind = args_2->kind;
  reg._2_1_ = args_2->field_0x2;
  reg.numFlags.raw = (args_2->numFlags).raw;
  reg.rawLen = args_2->rawLen;
  reg.info = args_2->info;
  name.kind = args_3->kind;
  name._2_1_ = args_3->field_0x2;
  name.numFlags.raw = (args_3->numFlags).raw;
  name.rawLen = args_3->rawLen;
  name.info = args_3->info;
  slang::syntax::UdpOutputPortDeclSyntax::UdpOutputPortDeclSyntax
            (this_00,args,keyword,reg,name,*args_4);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }